

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uchar *ttf_data;
  ImFont *pIVar2;
  ushort *puVar3;
  long lVar4;
  uchar *puVar5;
  ushort *puVar6;
  uint uVar7;
  ImFontConfig *pIVar8;
  ulong uVar9;
  uint ttf_size;
  bool bVar10;
  byte bVar11;
  ImFontConfig font_cfg;
  ImFontConfig local_a8;
  
  bVar11 = 0;
  uVar7 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar7 = *compressed_ttf_data;
  if (((uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) ==
       0x57bc0000) &&
     (uVar7 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar7 >> 0x18 == 0 && (uVar7 & 0xff0000) == 0) && (uVar7 & 0xff00) == 0) &&
     (uVar7 & 0xff) == 0)) {
    uVar7 = *(uint *)((long)compressed_ttf_data + 8);
    stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
    puVar5 = ttf_data +
             (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
    puVar6 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier2 = (uchar *)compressed_ttf_data;
    stb__barrier = puVar5;
    stb__barrier4 = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar1 = (byte)*puVar6;
      uVar7 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar6 + 3) |
                             (ulong)*(byte *)((long)puVar6 + 1) << 0x10 |
                            (ulong)(byte)puVar6[1] << 8),
                           (ushort)(puVar6[2] << 8 | puVar6[2] >> 8) + 1);
                puVar3 = puVar6 + 3;
              }
              else {
                if (uVar7 == 6) {
                  uVar9 = ~((ulong)*(byte *)((long)puVar6 + 3) |
                            (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8
                           );
                  uVar7 = (uint)(byte)puVar6[2];
                  goto LAB_0018b64f;
                }
                puVar3 = puVar6;
                if (uVar7 == 7) {
                  stb__lit((byte *)((long)puVar6 + 3),
                           (ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                   *(ushort *)((long)puVar6 + 1) >> 8) + 1);
                  puVar3 = (ushort *)
                           ((long)puVar6 +
                           (ulong)(ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                          *(ushort *)((long)puVar6 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((uchar *)(puVar6 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar6 + 1)) - 0x7ff);
              puVar3 = (ushort *)
                       ((long)puVar6 + ((ulong)(ushort)(*puVar6 << 8 | *puVar6 >> 8) - 0x7fd));
            }
          }
          else {
            uVar9 = -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                             ((uint)(byte)puVar6[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar7 = (uint)(ushort)(*(ushort *)((long)puVar6 + 3) << 8 |
                                  *(ushort *)((long)puVar6 + 3) >> 8);
LAB_0018b64f:
            stb__match(stb__dout + uVar9,uVar7 + 1);
            puVar3 = (ushort *)((long)puVar6 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                              ((uint)(byte)puVar6[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar6 + 3) + 1);
          puVar3 = puVar6 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar6 + 1),uVar7 - 0x7f);
        puVar3 = puVar6 + 1;
      }
      else if (bVar1 < 0x40) {
        stb__lit((byte *)((long)puVar6 + 1),uVar7 - 0x1f);
        puVar3 = (ushort *)((long)puVar6 + ((ulong)(byte)*puVar6 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar6 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar6[1] + 1);
        puVar3 = (ushort *)((long)puVar6 + 3);
      }
      if (puVar3 == puVar6) {
        if (((byte)*puVar3 != 5) || (*(byte *)((long)puVar3 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                        ,0x9d1,
                        "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout != puVar5) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                        ,0x9cb,
                        "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
      }
      else if (puVar5 < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                      ,0x9d5,
                      "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)")
        ;
      }
      bVar10 = puVar3 != puVar6;
      puVar6 = puVar3;
    } while (bVar10);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_a8.FontData = (void *)0x0;
    local_a8.FontDataSize = 0;
    local_a8.GlyphExtraSpacing.x = 0.0;
    local_a8.GlyphExtraSpacing.y = 0.0;
    local_a8.GlyphOffset.x = 0.0;
    local_a8.GlyphOffset.y = 0.0;
    local_a8.FontDataOwnedByAtlas = true;
    local_a8.FontNo = 0;
    local_a8.SizePixels = 0.0;
    local_a8.OversampleH = 3;
    local_a8.OversampleV = 1;
    local_a8.PixelSnapH = false;
    local_a8.GlyphRanges = (ImWchar *)0x0;
    local_a8.MergeMode = false;
    local_a8.RasterizerFlags = 0;
    local_a8.RasterizerMultiply = 1.0;
    local_a8.Name[0] = '\0';
    local_a8.Name[1] = '\0';
    local_a8.Name[2] = '\0';
    local_a8.Name[3] = '\0';
    local_a8.Name[4] = '\0';
    local_a8.Name[5] = '\0';
    local_a8.Name[6] = '\0';
    local_a8.Name[7] = '\0';
    local_a8.Name[8] = '\0';
    local_a8.Name[9] = '\0';
    local_a8.Name[10] = '\0';
    local_a8.Name[0xb] = '\0';
    local_a8.Name[0xc] = '\0';
    local_a8.Name[0xd] = '\0';
    local_a8.Name[0xe] = '\0';
    local_a8.Name[0xf] = '\0';
    local_a8.Name[0x10] = '\0';
    local_a8.Name[0x11] = '\0';
    local_a8.Name[0x12] = '\0';
    local_a8.Name[0x13] = '\0';
    local_a8.Name[0x14] = '\0';
    local_a8.Name[0x15] = '\0';
    local_a8.Name[0x16] = '\0';
    local_a8.Name[0x17] = '\0';
    local_a8.Name[0x18] = '\0';
    local_a8.Name[0x19] = '\0';
    local_a8.Name[0x1a] = '\0';
    local_a8.Name[0x1b] = '\0';
    local_a8.Name[0x1c] = '\0';
    local_a8.Name[0x1d] = '\0';
    local_a8.Name[0x1e] = '\0';
    local_a8.Name[0x1f] = '\0';
    local_a8.DstFont = (ImFont *)0x0;
  }
  else {
    pIVar8 = &local_a8;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      pIVar8->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar11 * -0x10 + 8);
      pIVar8 = (ImFontConfig *)((long)pIVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
  }
  if (local_a8.FontData != (void *)0x0) {
    __assert_fail("font_cfg.FontData == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x518,
                  "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  local_a8.FontDataOwnedByAtlas = true;
  pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_a8,glyph_ranges);
  return pIVar2;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}